

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  Extension *pEVar2;
  Nonnull<const_char_*> failure_msg;
  MessageLite *this_00;
  Arena *arena;
  ExtensionSet *const_this;
  anon_enum_32 local_3c;
  LogMessageFatal local_38;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  local_38.super_LogMessage.errno_saver_.saved_errno_ = pEVar2->is_repeated ^ CPPTYPE_INT32;
  local_3c = OPTIONAL_FIELD;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                          ((anon_enum_32 *)&local_38,&local_3c,
                           "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_38.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar2->type);
    local_3c = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_38,&local_3c,
                             "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pAVar1 = this->arena_;
      if ((pEVar2->field_0xa & 4) == 0) {
        this_00 = (MessageLite *)(pEVar2->field_0).int64_t_value;
        if (pAVar1 != (Arena *)0x0) {
          this_00 = MessageLite::New(this_00);
          MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)pEVar2->field_0);
        }
      }
      else {
        this_00 = (MessageLite *)
                  (**(code **)(**(long **)&(pEVar2->field_0).int32_t_value + 0x40))
                            (*(long **)&(pEVar2->field_0).int32_t_value,prototype,pAVar1);
        if ((pAVar1 == (Arena *)0x0) && ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0)) {
          (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
        }
      }
      Erase(this,number);
      return this_00;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x309,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}